

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O0

void lzma_lzma_optimum_fast
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  uint uVar1;
  lzma_lzma1_encoder *plVar2;
  uint32_t uVar3;
  int iVar4;
  uint8_t *__s1;
  short *psVar5;
  short *psVar6;
  bool bVar7;
  uint local_a4;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint32_t i_1;
  uint32_t limit;
  uint32_t new_dist;
  uint32_t back_main;
  uint32_t len;
  uint8_t *buf_back;
  uint32_t i;
  uint32_t rep_index;
  uint32_t rep_len;
  uint32_t buf_avail;
  uint8_t *buf;
  uint local_58;
  uint32_t matches_count;
  uint32_t len_main;
  uint32_t nice_len;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_lzma1_encoder *coder_local;
  uint64_t x;
  short *local_20;
  short *local_18;
  uint local_c;
  
  matches_count = mf->nice_len;
  _len_main = len_res;
  len_res_local = back_res;
  back_res_local = (uint32_t *)mf;
  mf_local = (lzma_mf *)coder;
  if (mf->read_ahead == 0) {
    local_58 = lzma_mf_find(mf,(uint32_t *)((long)&buf + 4),coder->matches);
  }
  else {
    if (mf->read_ahead != 1) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x20,
                    "void lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    local_58 = coder->longest_match_length;
    buf._4_4_ = coder->matches_count;
  }
  __s1 = mf_ptr((lzma_mf *)back_res_local);
  psVar5 = (short *)(__s1 + -1);
  uVar3 = mf_avail((lzma_mf *)back_res_local);
  if (uVar3 + 1 < 0x111) {
    uVar3 = mf_avail((lzma_mf *)back_res_local);
    local_98 = uVar3 + 1;
  }
  else {
    local_98 = 0x111;
  }
  if (local_98 < 2) {
    *len_res_local = 0xffffffff;
    *_len_main = 1;
  }
  else {
    i = 0;
    buf_back._4_4_ = 0;
    for (buf_back._0_4_ = 0; (uint)buf_back < 4; buf_back._0_4_ = (uint)buf_back + 1) {
      psVar6 = (short *)((long)psVar5 + (-1 - (ulong)(&mf_local[6].offset)[(uint)buf_back]));
      if (*psVar5 == *psVar6) {
        x._4_4_ = 2;
        x._0_4_ = local_98;
        local_20 = psVar6;
        local_18 = psVar5;
        if (local_98 < 2) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if (0x7fffffff < local_98) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
LAB_006c3d28:
        if (x._4_4_ < local_98) {
          coder_local = (lzma_lzma1_encoder *)
                        (*(long *)((long)psVar5 + (ulong)x._4_4_) -
                        *(long *)((long)psVar6 + (ulong)x._4_4_));
          if (coder_local == (lzma_lzma1_encoder *)0x0) goto LAB_006c3d8a;
          uVar1 = 0;
          for (plVar2 = coder_local; ((ulong)plVar2 & 1) == 0;
              plVar2 = (lzma_lzma1_encoder *)((ulong)plVar2 >> 1 | 0x8000000000000000)) {
            uVar1 = uVar1 + 1;
          }
          x._4_4_ = (uVar1 >> 3) + x._4_4_;
          local_9c = x._4_4_;
          if (local_98 <= x._4_4_) {
            local_9c = local_98;
          }
          local_c = local_9c;
        }
        else {
          local_c = local_98;
        }
        if (matches_count <= local_c) {
          *len_res_local = (uint)buf_back;
          *_len_main = local_c;
          mf_skip((lzma_mf *)back_res_local,local_c - 1);
          return;
        }
        if (i < local_c) {
          buf_back._4_4_ = (uint)buf_back;
          i = local_c;
        }
      }
    }
    if (local_58 < matches_count) {
      limit = 0;
      if (1 < local_58) {
        limit = (&mf_local[6].pending)[(ulong)(buf._4_4_ - 1) * 2];
        while( true ) {
          bVar7 = false;
          if (1 < buf._4_4_) {
            bVar7 = local_58 == (&mf_local[6].write_pos)[(ulong)(buf._4_4_ - 2) * 2] + 1;
          }
          if ((!bVar7) || (limit >> 7 <= (&mf_local[6].pending)[(ulong)(buf._4_4_ - 2) * 2])) break;
          local_58 = (&mf_local[6].write_pos)[(ulong)(buf._4_4_ - 2) * 2];
          limit = (&mf_local[6].pending)[(ulong)(buf._4_4_ - 2) * 2];
          buf._4_4_ = buf._4_4_ - 1;
        }
        if ((local_58 == 2) && (0x7f < limit)) {
          local_58 = 1;
        }
      }
      if ((i < 2) ||
         (((i + 1 < local_58 && ((i + 2 < local_58 || (limit < 0x201)))) &&
          ((i + 3 < local_58 || (limit < 0x8001)))))) {
        if ((local_58 < 2) || (local_98 < 3)) {
          *len_res_local = 0xffffffff;
          *_len_main = 1;
        }
        else {
          uVar3 = lzma_mf_find((lzma_mf *)back_res_local,
                               (uint32_t *)((long)&mf_local[0x18].hash + 4),
                               (lzma_match *)&mf_local[6].write_pos);
          *(uint32_t *)&mf_local[0x18].son = uVar3;
          if ((*(uint *)&mf_local[0x18].son < 2) ||
             (((((uVar1 = (&mf_local[6].pending)
                          [(ulong)(*(int *)((long)&mf_local[0x18].hash + 4) - 1) * 2],
                 *(uint *)&mf_local[0x18].son < local_58 || (limit <= uVar1)) &&
                ((*(int *)&mf_local[0x18].son != local_58 + 1 || (limit < uVar1 >> 7)))) &&
               (*(uint *)&mf_local[0x18].son <= local_58 + 1)) &&
              (((*(int *)&mf_local[0x18].son + 1U < local_58 || (local_58 < 3)) ||
               (limit >> 7 <= uVar1)))))) {
            if (local_58 - 1 < 2) {
              local_a4 = 2;
            }
            else {
              local_a4 = local_58 - 1;
            }
            for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
              iVar4 = memcmp(__s1,__s1 + (-1 - (ulong)(&mf_local[6].offset)[local_94]),
                             (ulong)local_a4);
              if (iVar4 == 0) {
                *len_res_local = 0xffffffff;
                *_len_main = 1;
                return;
              }
            }
            *len_res_local = limit + 4;
            *_len_main = local_58;
            mf_skip((lzma_mf *)back_res_local,local_58 - 2);
          }
          else {
            *len_res_local = 0xffffffff;
            *_len_main = 1;
          }
        }
      }
      else {
        *len_res_local = buf_back._4_4_;
        *_len_main = i;
        mf_skip((lzma_mf *)back_res_local,i - 1);
      }
    }
    else {
      *len_res_local = (&mf_local[6].pending)[(ulong)(buf._4_4_ - 1) * 2] + 4;
      *_len_main = local_58;
      mf_skip((lzma_mf *)back_res_local,local_58 - 1);
    }
  }
  return;
LAB_006c3d8a:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_006c3d28;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint8_t *buf = mf_ptr(mf) - 1;
	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		const uint32_t len = lzma_memcmplen(
				buf, buf_back, 2, buf_avail);

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	uint32_t back_main = 0;
	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	const uint32_t limit = my_max(2, len_main - 1);

	for (uint32_t i = 0; i < REPS; ++i) {
		if (memcmp(buf, buf - coder->reps[i] - 1, limit) == 0) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REPS;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}